

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  float local_30;
  float target_y;
  float cr_y;
  float cr_x;
  ImGuiContext *g;
  ImGuiWindow *pIStack_18;
  bool snap_on_edges_local;
  ImGuiWindow *window_local;
  ImVec2 scroll;
  
  _cr_y = GImGui;
  window_local = *(ImGuiWindow **)&window->Scroll;
  if ((window->ScrollTarget).x <= 3.4028235e+38 && (window->ScrollTarget).x != 3.4028235e+38) {
    target_y = (window->ScrollTargetCenterRatio).x;
    window_local = (ImGuiWindow *)
                   CONCAT44(window_local._4_4_,
                            -target_y * ((window->SizeFull).x - (window->ScrollbarSizes).x) +
                            (window->ScrollTarget).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  g._7_1_ = snap_on_edges;
  pIStack_18 = window;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    local_30 = (window->ScrollTargetCenterRatio).y;
    local_34 = (window->ScrollTarget).y;
    if (((snap_on_edges) && (local_30 <= 0.0)) && (local_34 <= (window->WindowPadding).y)) {
      local_34 = 0.0;
    }
    if (((snap_on_edges) && (1.0 <= local_30)) &&
       (((window->SizeContents).y - (window->WindowPadding).y) + (GImGui->Style).ItemSpacing.y <=
        local_34)) {
      local_34 = (window->SizeContents).y;
    }
    fVar5 = local_34;
    fVar2 = 1.0 - local_30;
    fVar3 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(pIStack_18);
    window_local = (ImGuiWindow *)
                   CONCAT44(-local_30 * ((pIStack_18->SizeFull).y - (pIStack_18->ScrollbarSizes).y)
                            + -fVar2 * (fVar3 + fVar4) + fVar5,window_local._0_4_);
  }
  ImVec2::ImVec2(&local_44,0.0,0.0);
  local_3c = ImMax((ImVec2 *)&window_local,&local_44);
  window_local = (ImGuiWindow *)local_3c;
  if (((pIStack_18->Collapsed & 1U) == 0) && ((pIStack_18->SkipItems & 1U) == 0)) {
    window_local._0_4_ = local_3c.x;
    fVar5 = window_local._0_4_;
    fVar2 = GetScrollMaxX(pIStack_18);
    fVar2 = ImMin<float>(fVar5,fVar2);
    fVar5 = window_local._4_4_;
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,fVar2);
    fVar2 = GetScrollMaxY(pIStack_18);
    fVar5 = ImMin<float>(fVar5,fVar2);
    window_local = (ImGuiWindow *)CONCAT44(fVar5,window_local._0_4_);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        scroll.x = window->ScrollTarget.x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->SizeContents.y - window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->SizeContents.y;
        scroll.y = target_y - (1.0f - cr_y) * (window->TitleBarHeight() + window->MenuBarHeight()) - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, GetScrollMaxX(window));
        scroll.y = ImMin(scroll.y, GetScrollMaxY(window));
    }
    return scroll;
}